

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

void __thiscall Strings::QuotedEncoding::writeHex(QuotedEncoding *this,char c)

{
  int iVar1;
  String SStack_28;
  
  if (this->lineLength < 0x49) {
    iVar1 = this->lineLength + 3;
  }
  else {
    Bstrlib::String::operator+=(this->out,"=\r\n");
    iVar1 = 3;
  }
  this->lineLength = iVar1;
  Bstrlib::String::Print((char *)&SStack_28,"=%2x",(ulong)(uint)(int)c);
  Bstrlib::String::operator+=(this->out,&SStack_28);
  Bstrlib::String::~String(&SStack_28);
  return;
}

Assistant:

void writeHex(const char c)
        {
            // Check for line cut
            if (lineLength >= 73) { out += "=\r\n"; lineLength = 3; }
	        else lineLength += 3;
	        out += FastString::Print("=%2x", c);
        }